

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Version::LevelFileNumIterator::Prev(LevelFileNumIterator *this)

{
  uint uVar1;
  size_type sVar2;
  LevelFileNumIterator *this_local;
  
  uVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0xb6,"virtual void leveldb::Version::LevelFileNumIterator::Prev()");
  }
  if (this->index_ == 0) {
    sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (this->flist_);
    this->index_ = (uint32_t)sVar2;
  }
  else {
    this->index_ = this->index_ - 1;
  }
  return;
}

Assistant:

void Prev() override {
    assert(Valid());
    if (index_ == 0) {
      index_ = flist_->size();  // Marks as invalid
    } else {
      index_--;
    }
  }